

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmFileTimeCache *this_00;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  string *psVar8;
  bool bVar9;
  string internalDependFile;
  int result;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  validDependencies;
  int result_1;
  string dependFile;
  string targetDir;
  ostringstream msg;
  string local_670;
  string local_650;
  undefined1 local_630 [32];
  _Base_ptr local_610;
  size_t local_608;
  int local_5fc;
  string local_5f8;
  string local_5d8;
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8 [6];
  ios_base local_548 [1304];
  
  bVar4 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((((!bVar4) || (cmSystemTools::s_ErrorOccured != false)) ||
      (cmSystemTools::s_FatalErrorOccured != false)) ||
     (bVar4 = cmSystemTools::GetInterruptFlag(), bVar4)) {
    cmSystemTools::Error
              ("Target DependInfo.cmake file not found",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  CheckMultipleOutputs(this,verbose);
  cmsys::SystemTools::GetFilenamePath(&local_5d8,tgtInfo);
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_670,local_5d8._M_dataplus._M_p,
             local_5d8._M_dataplus._M_p + local_5d8._M_string_length);
  std::__cxx11::string::append((char *)&local_670);
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5f8,local_5d8._M_dataplus._M_p,
             local_5d8._M_dataplus._M_p + local_5d8._M_string_length);
  std::__cxx11::string::append((char *)&local_5f8);
  this_00 = ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            CMakeInstance->FileTimeCache;
  bVar4 = cmFileTimeCache::Compare(this_00,&local_670,tgtInfo,(int *)&local_650);
  bVar9 = -1 < (int)local_650._M_dataplus._M_p;
  if (verbose && (!bVar4 || !bVar9)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"Dependee \"",10);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(tgtInfo->_M_dataplus)._M_p,tgtInfo->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is newer than depender \"",0x1a);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_670._M_dataplus._M_p,local_670._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)local_630);
    if ((undefined1 *)local_630._0_8_ != local_630 + 0x10) {
      operator_delete((void *)local_630._0_8_,local_630._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
    std::ios_base::~ios_base(local_548);
  }
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  pcVar1 = local_630 + 0x10;
  pcVar3 = (psVar8->_M_dataplus)._M_p;
  local_630._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_630,pcVar3,pcVar3 + psVar8->_M_string_length);
  std::__cxx11::string::append(local_630);
  std::__cxx11::string::append(local_630);
  bVar5 = cmFileTimeCache::Compare(this_00,&local_670,(string *)local_630,&local_5fc);
  if (bVar5 && -1 < local_5fc) {
    if ((char *)local_630._0_8_ != pcVar1) {
      operator_delete((void *)local_630._0_8_,local_630._16_8_ + 1);
    }
    local_630._24_8_ = local_630 + 8;
    local_630._8_4_ = _S_red;
    local_630._16_8_ = 0;
    local_608 = 0;
    local_610 = (_Base_ptr)local_630._24_8_;
    cmDependsC::cmDependsC((cmDependsC *)local_5b8);
    local_5a8[0]._0_1_ = verbose;
    local_5a8[0]._8_8_ = this_00;
    bVar5 = cmDepends::Check((cmDepends *)local_5b8,&local_5f8,&local_670,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                              *)local_630);
    cmDependsC::~cmDependsC((cmDependsC *)local_5b8);
    bVar6 = true;
    if ((bVar4 && bVar9) && bVar5) goto LAB_003652ce;
  }
  else {
    if (verbose) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"Dependee \"",10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_5b8,(char *)local_630._0_8_,
                          CONCAT44(local_630._12_4_,local_630._8_4_));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is newer than depender \"",0x1a)
      ;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_670._M_dataplus._M_p,local_670._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout(&local_650);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650._M_dataplus._M_p != &local_650.field_2) {
        operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
      std::ios_base::~ios_base(local_548);
    }
    if ((char *)local_630._0_8_ != pcVar1) {
      operator_delete((void *)local_630._0_8_,local_630._16_8_ + 1);
    }
    local_630._24_8_ = local_630 + 8;
    local_630._8_4_ = _S_red;
    local_630._16_8_ = 0;
    local_608 = 0;
    local_610 = (_Base_ptr)local_630._24_8_;
  }
  cmsys::SystemTools::GetFilenameName((string *)local_5b8,&local_5d8);
  std::__cxx11::string::substr((ulong)&local_650,(ulong)local_5b8);
  std::__cxx11::string::operator=((string *)local_5b8,(string *)&local_650);
  paVar2 = &local_650.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != paVar2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  local_650._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_650,"Scanning dependencies of target ","");
  std::__cxx11::string::_M_append((char *)&local_650,local_5b8._0_8_);
  cmSystemTools::MakefileColorEcho(0x106,local_650._M_dataplus._M_p,true,color);
  bVar6 = ScanDependencies(this,&local_5d8,&local_5f8,&local_670,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                            *)local_630);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != paVar2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
    operator_delete((void *)local_5b8._0_8_,
                    CONCAT71(local_5a8[0]._M_allocated_capacity._1_7_,local_5a8[0]._M_local_buf[0])
                    + 1);
  }
LAB_003652ce:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
               *)local_630);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccuredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  std::string const internalDependFile = targetDir + "/depend.internal";
  std::string const dependFile = targetDir + "/depend.make";

  // If the target DependInfo.cmake file has changed since the last
  // time dependencies were scanned then force rescanning.  This may
  // happen when a new source file is added and CMake regenerates the
  // project but no other sources were touched.
  bool needRescanDependInfo = false;
  cmFileTimeCache* ftc =
    this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
  {
    int result;
    if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << tgtInfo << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
      needRescanDependInfo = true;
    }
  }

  // If the directory information is newer than depend.internal, include dirs
  // may have changed. In this case discard all old dependencies.
  bool needRescanDirInfo = false;
  {
    std::string dirInfoFile = this->GetCurrentBinaryDirectory();
    dirInfoFile += "/CMakeFiles";
    dirInfoFile += "/CMakeDirectoryInformation.cmake";
    int result;
    if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dirInfoFile << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
      needRescanDirInfo = true;
    }
  }

  // Check the implicit dependencies to see if they are up to date.
  // The build.make file may have explicit dependencies for the object
  // files but these will not affect the scanning process so they need
  // not be considered.
  std::map<std::string, cmDepends::DependencyVector> validDependencies;
  bool needRescanDependencies = false;
  if (!needRescanDirInfo) {
    cmDependsC checker;
    checker.SetVerbose(verbose);
    checker.SetFileTimeCache(ftc);
    // cmDependsC::Check() fills the vector validDependencies() with the
    // dependencies for those files where they are still valid, i.e. neither
    // the files themselves nor any files they depend on have changed.
    // We don't do that if the CMakeDirectoryInformation.cmake file has
    // changed, because then potentially all dependencies have changed.
    // This information is given later on to cmDependsC, which then only
    // rescans the files where it did not get valid dependencies via this
    // dependency vector. This means that in the normal case, when only
    // few or one file have been edited, then also only this one file is
    // actually scanned again, instead of all files for this target.
    needRescanDependencies =
      !checker.Check(dependFile, internalDependFile, validDependencies);
  }

  if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
    // The dependencies must be regenerated.
    std::string targetName = cmSystemTools::GetFilenameName(targetDir);
    targetName = targetName.substr(0, targetName.length() - 4);
    std::string message = "Scanning dependencies of target ";
    message += targetName;
    cmSystemTools::MakefileColorEcho(cmsysTerminal_Color_ForegroundMagenta |
                                       cmsysTerminal_Color_ForegroundBold,
                                     message.c_str(), true, color);

    return this->ScanDependencies(targetDir, dependFile, internalDependFile,
                                  validDependencies);
  }

  // The dependencies are already up-to-date.
  return true;
}